

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::anon_unknown_23::IsNonMessageType(anon_unknown_23 *this,string_view type)

{
  bool bVar1;
  int iVar2;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this_00;
  long lVar3;
  undefined **ppuVar4;
  char **ppcVar5;
  byte bVar6;
  allocator_type local_a3;
  key_equal local_a2;
  hasher local_a1;
  string_view type_local;
  char *local_90 [16];
  
  type_local._M_str = (char *)type._M_len;
  bVar6 = 0;
  type_local._M_len = (size_t)this;
  if ((anonymous_namespace)::IsNonMessageType(std::basic_string_view<char,std::char_traits<char>>)::
      non_message_types == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 IsNonMessageType(std::basic_string_view<char,std::char_traits<char>>)
                                 ::non_message_types,type_local._M_str,type._M_str);
    if (iVar2 != 0) {
      this_00 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                 *)operator_new(0x20);
      ppuVar4 = &PTR_anon_var_dwarf_160d28_004addc0;
      ppcVar5 = local_90;
      for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
        *ppcVar5 = *ppuVar4;
        ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
        ppcVar5 = ppcVar5 + (ulong)bVar6 * -2 + 1;
      }
      absl::lts_20240722::container_internal::
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::raw_hash_set<char_const*const*>
                (this_00,local_90,(char **)&stack0xfffffffffffffff0,0,&local_a1,&local_a2,&local_a3)
      ;
      IsNonMessageType::non_message_types =
           (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)this_00;
      __cxa_guard_release(&(anonymous_namespace)::
                           IsNonMessageType(std::basic_string_view<char,std::char_traits<char>>)::
                           non_message_types);
    }
  }
  bVar1 = absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::contains<std::basic_string_view<char,std::char_traits<char>>>
                    ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                      *)IsNonMessageType::non_message_types,&type_local);
  return bVar1;
}

Assistant:

bool IsNonMessageType(absl::string_view type) {
  static const auto* non_message_types =
      new absl::flat_hash_set<absl::string_view>(
          {"double", "float", "int64", "uint64", "int32", "fixed32", "fixed64",
           "bool", "string", "bytes", "uint32", "enum", "sfixed32", "sfixed64",
           "sint32", "sint64"});
  return non_message_types->contains(type);
}